

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionResultBuilder::ExpressionResultBuilder
          (ExpressionResultBuilder *this,OfType resultType)

{
  OfType resultType_local;
  ExpressionResultBuilder *this_local;
  
  AssertionResultData::AssertionResultData(&this->m_data);
  ExprComponents::ExprComponents(&this->m_exprComponents);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream);
  (this->m_data).resultType = resultType;
  return;
}

Assistant:

ExpressionResultBuilder::ExpressionResultBuilder( ResultWas::OfType resultType ) {
        m_data.resultType = resultType;
    }